

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client2.c
# Opt level: O0

int my_recv(void *ctx,uchar *buf,size_t len)

{
  int ret;
  size_t len_local;
  uchar *buf_local;
  void *ctx_local;
  
  if (my_recv::first_try == 0) {
    ctx_local._4_4_ = mbedtls_net_recv(ctx,buf,len);
    if (ctx_local._4_4_ != -0x6900) {
      my_recv::first_try = 1;
    }
  }
  else {
    my_recv::first_try = 0;
    ctx_local._4_4_ = -0x6900;
  }
  return ctx_local._4_4_;
}

Assistant:

static int my_recv( void *ctx, unsigned char *buf, size_t len )
{
    static int first_try = 1;
    int ret;

    if( first_try )
    {
        first_try = 0;
        return( MBEDTLS_ERR_SSL_WANT_READ );
    }

    ret = mbedtls_net_recv( ctx, buf, len );
    if( ret != MBEDTLS_ERR_SSL_WANT_READ )
        first_try = 1; /* Next call will be a new operation */
    return( ret );
}